

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O0

void FinalAction(cmMakefile *makefile,string *name,cmListFileBacktrace *lfbt)

{
  string *args_1;
  cmake *this;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string msg;
  cmTarget *target;
  cmListFileBacktrace *lfbt_local;
  string *name_local;
  cmMakefile *makefile_local;
  
  msg.field_2._8_8_ = cmMakefile::FindLocalNonAliasTarget(makefile,name);
  if ((cmTarget *)msg.field_2._8_8_ == (cmTarget *)0x0) {
    cmAlphaNum::cmAlphaNum
              (&local_78,"FLTK_WRAP_UI was called with a target that was never created: ");
    cmAlphaNum::cmAlphaNum(&local_a8,name);
    args_1 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
    cmStrCat<char[65],std::__cxx11::string,char[43]>
              ((string *)local_48,&local_78,&local_a8,
               (char (*) [65])".  The problem was found while processing the source directory: ",
               args_1,(char (*) [43])".  This FLTK_WRAP_UI call will be ignored.");
    this = cmMakefile::GetCMakeInstance(makefile);
    cmake::IssueMessage(this,AUTHOR_ERROR,(string *)local_48,lfbt);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

static void FinalAction(cmMakefile& makefile, std::string const& name,
                        const cmListFileBacktrace& lfbt)
{
  // people should add the srcs to the target themselves, but the old command
  // didn't support that, so check and see if they added the files in and if
  // they didn;t then print a warning and add then anyhow
  cmTarget* target = makefile.FindLocalNonAliasTarget(name);
  if (!target) {
    std::string msg = cmStrCat(
      "FLTK_WRAP_UI was called with a target that was never created: ", name,
      ".  The problem was found while processing the source directory: ",
      makefile.GetCurrentSourceDirectory(),
      ".  This FLTK_WRAP_UI call will be ignored.");
    makefile.GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_ERROR, msg,
                                              lfbt);
  }
}